

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSOneofArray_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  OneofDescriptor **ppOVar5;
  size_type *psVar6;
  OneofDescriptor *pOVar7;
  undefined8 uVar8;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  OneofDescriptor **local_78;
  OneofDescriptor *local_70;
  OneofDescriptor *local_68;
  long lStack_60;
  string local_58;
  string local_38;
  
  OneofFieldsArrayName_abi_cxx11_
            (&local_38,this,(GeneratorOptions *)(options->library)._M_dataplus._M_p,
             (Descriptor *)field);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
  ppOVar5 = (OneofDescriptor **)(plVar3 + 2);
  if ((OneofDescriptor **)*plVar3 == ppOVar5) {
    local_68 = *ppOVar5;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *ppOVar5;
    local_78 = (OneofDescriptor **)*plVar3;
  }
  local_70 = (OneofDescriptor *)plVar3[1];
  *plVar3 = (long)ppOVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  JSOneofIndex_abi_cxx11_
            (&local_58,(_anonymous_namespace_ *)(options->library)._M_string_length,local_70);
  pOVar7 = (OneofDescriptor *)0xf;
  if (local_78 != &local_68) {
    pOVar7 = local_68;
  }
  if (pOVar7 < local_70 + local_58._M_string_length) {
    uVar8 = (OneofDescriptor *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar8 = local_58.field_2._M_allocated_capacity;
    }
    if (local_70 + local_58._M_string_length <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_0024bfc0;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
LAB_0024bfc0:
  local_98 = &local_88;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_88 = *puVar1;
    uStack_80 = puVar4[3];
  }
  else {
    local_88 = *puVar1;
    local_98 = (undefined8 *)*puVar4;
  }
  local_90 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSOneofArray(const GeneratorOptions& options,
                         const FieldDescriptor* field) {
  return OneofFieldsArrayName(options, field->containing_type()) + "[" +
         JSOneofIndex(field->containing_oneof()) + "]";
}